

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.h
# Opt level: O1

bool __thiscall chrono::fea::ChElementShellBST::IsSubBlockActive(ChElementShellBST *this,int nblock)

{
  byte bVar1;
  
  bVar1 = (**(code **)(*(long *)&((this->m_nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [this->nodes_used_to_six[nblock]].
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChNodeFEAbase + 0x18))();
  return (bool)(bVar1 ^ 1);
}

Assistant:

virtual bool IsSubBlockActive(int nblock) const override { return !m_nodes[nodes_used_to_six[nblock]]->GetFixed(); }